

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

void __thiscall Func::RemoveDeadYieldOffsetResumeLabel(Func *this,LabelInstr *label)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_16_2_767aac4c map;
  YieldOffsetResumeLabel local_40;
  LabelInstr *local_28;
  LabelInstr *label_local;
  uint32 offset;
  
  map.label = &local_28;
  map.offset = (uint32 *)((long)&label_local + 4);
  local_28 = label;
  bVar2 = JsUtil::
          List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
          ::
          MapUntil<Func::RemoveDeadYieldOffsetResumeLabel(IR::LabelInstr*)::_lambda(int,JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>&)_1_>
                    ((List<JsUtil::Pair<unsigned_int,IR::LabelInstr*,DefaultComparer>,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                      *)this->m_yieldOffsetResumeLabelList,map);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x3b5,"(found)","found");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40.first = label_local._4_4_;
  local_40.second = local_28;
  local_40.initialized = true;
  RemoveYieldOffsetResumeLabel(this,&local_40);
  AddYieldOffsetResumeLabel(this,label_local._4_4_,(LabelInstr *)0x0);
  return;
}

Assistant:

void RemoveDeadYieldOffsetResumeLabel(IR::LabelInstr* label)
    {
        uint32 offset;
        bool found = m_yieldOffsetResumeLabelList->MapUntil([&offset, &label](int i, YieldOffsetResumeLabel& yorl)
        {
            if (yorl.Second() == label)
            {
                offset = yorl.First();
                return true;
            }
            return false;
        });
        Assert(found);
        RemoveYieldOffsetResumeLabel(YieldOffsetResumeLabel(offset, label));
        AddYieldOffsetResumeLabel(offset, nullptr);
    }